

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O2

void __thiscall read_point_le::operator()(read_point_le *this,way_point_le *point,xr_reader *r)

{
  uint32_t *puVar1;
  uint16_t *puVar2;
  
  xray_re::xr_reader::r_fvector3(r,&(point->super_way_point).position);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (point->super_way_point).flags = *puVar1;
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  point->id = *puVar2;
  xray_re::xr_reader::r_sz(r,(string *)point);
  return;
}

Assistant:

void operator()(way_point_le& point, xr_reader& r) {
	r.r_fvector3(point.position);
	point.flags = r.r_u32();
	point.id = r.r_u16();
	r.r_sz(point.name);
}